

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

void __thiscall
QRhiTexture::QRhiTexture
          (QRhiTexture *this,QRhiImplementation *rhi,Format format_,QSize *pixelSize_,int depth_,
          int arraySize_,int sampleCount_,Flags flags_)

{
  quint64 qVar1;
  
  (this->super_QRhiResource).m_rhi = rhi;
  (this->super_QRhiResource).m_objectName.d.d = (Data *)0x0;
  (this->super_QRhiResource).m_objectName.d.ptr = (char *)0x0;
  (this->super_QRhiResource).m_objectName.d.size = 0;
  LOCK();
  UNLOCK();
  qVar1 = (long)counter._q_value.super___atomic_base<unsigned_long_long>._M_i + 1;
  counter._q_value.super___atomic_base<unsigned_long_long>._M_i =
       (Type)(Type)((long)counter._q_value.super___atomic_base<unsigned_long_long>._M_i + 1);
  (this->super_QRhiResource).m_id = qVar1;
  (this->super_QRhiResource)._vptr_QRhiResource = (_func_int **)&PTR__QRhiResource_00784738;
  this->m_format = format_;
  this->m_pixelSize = *pixelSize_;
  this->m_depth = depth_;
  this->m_arraySize = arraySize_;
  this->m_sampleCount = sampleCount_;
  (this->m_flags).super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
  super_QFlagsStorage<QRhiTexture::Flag>.i =
       (Int)flags_.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
            super_QFlagsStorage<QRhiTexture::Flag>.i;
  this->m_arrayRangeStart = -1;
  this->m_arrayRangeLength = -1;
  (this->m_readViewFormat).format = UnknownFormat;
  (this->m_readViewFormat).srgb = false;
  (this->m_writeViewFormat).format = UnknownFormat;
  (this->m_writeViewFormat).srgb = false;
  return;
}

Assistant:

QRhiTexture::QRhiTexture(QRhiImplementation *rhi, Format format_, const QSize &pixelSize_, int depth_,
                         int arraySize_, int sampleCount_, Flags flags_)
    : QRhiResource(rhi),
      m_format(format_), m_pixelSize(pixelSize_), m_depth(depth_),
      m_arraySize(arraySize_), m_sampleCount(sampleCount_), m_flags(flags_)
{
}